

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.cc
# Opt level: O3

string_view bloaty::dwarf::AttrValue::ReadVariableBlock(string_view *data)

{
  char *pcVar1;
  size_type __rlen;
  string_view sVar2;
  
  sVar2._M_len = ReadLEB128Internal(false,data);
  if (sVar2._M_len <= data->_M_len) {
    pcVar1 = data->_M_str;
    data->_M_str = pcVar1 + sVar2._M_len;
    data->_M_len = data->_M_len - sVar2._M_len;
    sVar2._M_str = pcVar1;
    return sVar2;
  }
  Throw("premature EOF reading variable-length DWARF data",0xad);
}

Assistant:

string_view AttrValue::ReadVariableBlock(string_view* data) {
  uint64_t len = ReadLEB128<uint64_t>(data);
  return ReadBytes(len, data);
}